

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_C_ParamSet.c
# Opt level: O2

void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_from_montgomery(uint64_t *out1,uint64_t *arg1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  bool bVar33;
  
  uVar26 = *arg1 * -0x209193d38d83e893;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar26;
  uVar17 = SUB168(auVar1 * ZEXT816(0x9b9f605f5a858107),0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar26;
  uVar20 = SUB168(auVar2 * ZEXT816(0xab1ec85e6b41c8aa),8);
  uVar18 = SUB168(auVar2 * ZEXT816(0xab1ec85e6b41c8aa),0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar26;
  uVar21 = SUB168(auVar3 * ZEXT816(0xcf846e86789051d3),8);
  uVar19 = SUB168(auVar3 * ZEXT816(0xcf846e86789051d3),0);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar26;
  uVar26 = SUB168(auVar4 * ZEXT816(0x7998f7b9022d759b),8);
  uVar27 = uVar26 + uVar19;
  uVar19 = (ulong)CARRY8(uVar26,uVar19);
  uVar26 = uVar21 + uVar18;
  uVar29 = uVar26 + uVar19;
  uVar19 = (ulong)(CARRY8(uVar21,uVar18) || CARRY8(uVar26,uVar19));
  uVar21 = uVar20 + uVar17;
  uVar23 = uVar21 + uVar19;
  uVar26 = (ulong)CARRY8(SUB168(auVar4 * ZEXT816(0x7998f7b9022d759b),0),*arg1);
  uVar28 = uVar27 + uVar26;
  uVar26 = (ulong)CARRY8(uVar27,uVar26);
  uVar30 = uVar29 + uVar26;
  uVar26 = (ulong)CARRY8(uVar29,uVar26);
  uVar27 = uVar23 + uVar26;
  bVar33 = CARRY8(uVar28,arg1[1]);
  uVar28 = uVar28 + arg1[1];
  uVar18 = (ulong)bVar33;
  uVar29 = uVar30 + uVar18;
  uVar18 = (ulong)CARRY8(uVar30,uVar18);
  uVar24 = uVar27 + uVar18;
  uVar23 = (ulong)CARRY8(uVar23,uVar26) +
           SUB168(auVar1 * ZEXT816(0x9b9f605f5a858107),8) +
           (ulong)(CARRY8(uVar20,uVar17) || CARRY8(uVar21,uVar19)) + (ulong)CARRY8(uVar27,uVar18);
  uVar26 = uVar28 * -0x209193d38d83e893;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar26;
  uVar20 = SUB168(auVar5 * ZEXT816(0x9b9f605f5a858107),0);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar26;
  uVar22 = SUB168(auVar6 * ZEXT816(0xab1ec85e6b41c8aa),8);
  uVar18 = SUB168(auVar6 * ZEXT816(0xab1ec85e6b41c8aa),0);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar26;
  uVar17 = SUB168(auVar7 * ZEXT816(0xcf846e86789051d3),8);
  uVar19 = SUB168(auVar7 * ZEXT816(0xcf846e86789051d3),0);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar26;
  uVar26 = SUB168(auVar8 * ZEXT816(0x7998f7b9022d759b),8);
  uVar21 = SUB168(auVar8 * ZEXT816(0x7998f7b9022d759b),0);
  uVar27 = uVar26 + uVar19;
  uVar19 = (ulong)CARRY8(uVar26,uVar19);
  uVar26 = uVar17 + uVar18;
  uVar25 = uVar26 + uVar19;
  uVar26 = (ulong)(CARRY8(uVar17,uVar18) || CARRY8(uVar26,uVar19));
  uVar17 = uVar22 + uVar20;
  uVar32 = uVar17 + uVar26;
  uVar19 = bVar33 + uVar30 + (ulong)CARRY8(uVar21,uVar28) + uVar27;
  uVar18 = (ulong)(CARRY8(uVar27,uVar29) || CARRY8(uVar27 + uVar29,(ulong)CARRY8(uVar28,uVar21)));
  uVar21 = uVar25 + uVar24;
  uVar28 = uVar21 + uVar18;
  uVar18 = (ulong)(CARRY8(uVar25,uVar24) || CARRY8(uVar21,uVar18));
  uVar27 = uVar23 + uVar18;
  uVar29 = uVar27 + uVar32;
  bVar33 = CARRY8(uVar19,arg1[2]);
  uVar19 = uVar19 + arg1[2];
  uVar21 = (ulong)bVar33;
  uVar25 = uVar28 + uVar21;
  uVar21 = (ulong)CARRY8(uVar28,uVar21);
  uVar24 = uVar29 + uVar21;
  uVar32 = (ulong)CARRY8(uVar23,uVar18) + (ulong)CARRY8(uVar27,uVar32) +
           SUB168(auVar5 * ZEXT816(0x9b9f605f5a858107),8) +
           (ulong)(CARRY8(uVar22,uVar20) || CARRY8(uVar17,uVar26)) + (ulong)CARRY8(uVar29,uVar21);
  uVar18 = uVar19 * -0x209193d38d83e893;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar18;
  uVar20 = SUB168(auVar9 * ZEXT816(0x9b9f605f5a858107),0);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar18;
  uVar27 = SUB168(auVar10 * ZEXT816(0xab1ec85e6b41c8aa),8);
  uVar21 = SUB168(auVar10 * ZEXT816(0xab1ec85e6b41c8aa),0);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar18;
  uVar17 = SUB168(auVar11 * ZEXT816(0xcf846e86789051d3),8);
  uVar26 = SUB168(auVar11 * ZEXT816(0xcf846e86789051d3),0);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar18;
  uVar18 = SUB168(auVar12 * ZEXT816(0x7998f7b9022d759b),8);
  uVar23 = SUB168(auVar12 * ZEXT816(0x7998f7b9022d759b),0);
  uVar29 = uVar18 + uVar26;
  uVar26 = (ulong)CARRY8(uVar18,uVar26);
  uVar18 = uVar17 + uVar21;
  uVar22 = uVar18 + uVar26;
  uVar18 = (ulong)(CARRY8(uVar17,uVar21) || CARRY8(uVar18,uVar26));
  uVar17 = uVar27 + uVar20;
  uVar30 = uVar17 + uVar18;
  uVar26 = bVar33 + uVar28 + (ulong)CARRY8(uVar23,uVar19) + uVar29;
  uVar19 = (ulong)(CARRY8(uVar29,uVar25) || CARRY8(uVar29 + uVar25,(ulong)CARRY8(uVar19,uVar23)));
  uVar21 = uVar22 + uVar24;
  uVar25 = uVar21 + uVar19;
  uVar19 = (ulong)(CARRY8(uVar22,uVar24) || CARRY8(uVar21,uVar19));
  uVar23 = uVar32 + uVar19;
  uVar29 = uVar23 + uVar30;
  bVar33 = CARRY8(uVar26,arg1[3]);
  uVar26 = uVar26 + arg1[3];
  uVar21 = (ulong)bVar33;
  uVar24 = uVar25 + uVar21;
  uVar21 = (ulong)CARRY8(uVar25,uVar21);
  uVar31 = uVar29 + uVar21;
  uVar30 = (ulong)CARRY8(uVar32,uVar19) + (ulong)CARRY8(uVar23,uVar30) +
           SUB168(auVar9 * ZEXT816(0x9b9f605f5a858107),8) +
           (ulong)(CARRY8(uVar27,uVar20) || CARRY8(uVar17,uVar18)) + (ulong)CARRY8(uVar29,uVar21);
  uVar18 = uVar26 * -0x209193d38d83e893;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar18;
  uVar20 = SUB168(auVar13 * ZEXT816(0x9b9f605f5a858107),0);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar18;
  uVar23 = SUB168(auVar14 * ZEXT816(0xab1ec85e6b41c8aa),8);
  uVar21 = SUB168(auVar14 * ZEXT816(0xab1ec85e6b41c8aa),0);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar18;
  uVar27 = SUB168(auVar15 * ZEXT816(0xcf846e86789051d3),8);
  uVar19 = SUB168(auVar15 * ZEXT816(0xcf846e86789051d3),0);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar18;
  uVar18 = SUB168(auVar16 * ZEXT816(0x7998f7b9022d759b),8);
  uVar17 = SUB168(auVar16 * ZEXT816(0x7998f7b9022d759b),0);
  uVar29 = uVar18 + uVar19;
  uVar19 = (ulong)CARRY8(uVar18,uVar19);
  uVar18 = uVar27 + uVar21;
  uVar22 = uVar18 + uVar19;
  uVar18 = (ulong)(CARRY8(uVar27,uVar21) || CARRY8(uVar18,uVar19));
  uVar21 = uVar23 + uVar20;
  uVar28 = uVar21 + uVar18;
  uVar19 = bVar33 + uVar25 + (ulong)CARRY8(uVar17,uVar26) + uVar29;
  uVar26 = (ulong)(CARRY8(uVar29,uVar24) || CARRY8(uVar29 + uVar24,(ulong)CARRY8(uVar26,uVar17)));
  uVar17 = uVar22 + uVar31;
  uVar27 = uVar17 + uVar26;
  uVar26 = (ulong)(CARRY8(uVar22,uVar31) || CARRY8(uVar17,uVar26));
  uVar17 = uVar30 + uVar26;
  uVar29 = uVar17 + uVar28;
  uVar21 = (ulong)CARRY8(uVar30,uVar26) +
           SUB168(auVar13 * ZEXT816(0x9b9f605f5a858107),8) +
           (ulong)(CARRY8(uVar23,uVar20) || CARRY8(uVar21,uVar18)) + (ulong)CARRY8(uVar17,uVar28);
  uVar26 = (ulong)(byte)-((0x7998f7b9022d759a < uVar19) + -1);
  uVar20 = uVar27 - uVar26;
  uVar26 = (ulong)(byte)-((-1 - (uVar27 < uVar26)) + (0xcf846e86789051d2 < uVar20));
  uVar23 = uVar29 - uVar26;
  uVar26 = (ulong)(byte)-((-1 - (uVar29 < uVar26)) + (0xab1ec85e6b41c8a9 < uVar23));
  uVar17 = uVar21 - uVar26;
  uVar26 = -(ulong)((char)((-1 - (uVar21 < uVar26)) + (0x9b9f605f5a858106 < uVar17)) != '\0');
  uVar18 = ~uVar26;
  *out1 = uVar19 + 0x86670846fdd28a65 & uVar18 | uVar19 & uVar26;
  out1[1] = uVar20 + 0x307b9179876fae2d & uVar18 | uVar27 & uVar26;
  out1[2] = uVar23 + 0x54e137a194be3756 & uVar18 | uVar29 & uVar26;
  out1[3] = uVar18 & uVar17 + 0x64609fa0a57a7ef9 | uVar26 & uVar21;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_from_montgomery(
    uint64_t out1[4], const uint64_t arg1[4]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    uint64_t x9;
    uint64_t x10;
    uint64_t x11;
    uint64_t x12;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x13;
    uint64_t x14;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x15;
    uint64_t x16;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x17;
    uint64_t x18;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x19;
    uint64_t x20;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x21;
    uint64_t x22;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x23;
    uint64_t x24;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x25;
    uint64_t x26;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x27;
    uint64_t x28;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x29;
    uint64_t x30;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x31;
    uint64_t x32;
    uint64_t x33;
    uint64_t x34;
    uint64_t x35;
    uint64_t x36;
    uint64_t x37;
    uint64_t x38;
    uint64_t x39;
    uint64_t x40;
    uint64_t x41;
    uint64_t x42;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x43;
    uint64_t x44;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x45;
    uint64_t x46;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x47;
    uint64_t x48;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x49;
    uint64_t x50;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x51;
    uint64_t x52;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x53;
    uint64_t x54;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x55;
    uint64_t x56;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x57;
    uint64_t x58;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x59;
    uint64_t x60;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x61;
    uint64_t x62;
    uint64_t x63;
    uint64_t x64;
    uint64_t x65;
    uint64_t x66;
    uint64_t x67;
    uint64_t x68;
    uint64_t x69;
    uint64_t x70;
    uint64_t x71;
    uint64_t x72;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x73;
    uint64_t x74;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x75;
    uint64_t x76;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x77;
    uint64_t x78;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x79;
    uint64_t x80;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x81;
    uint64_t x82;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x83;
    uint64_t x84;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x85;
    uint64_t x86;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x87;
    uint64_t x88;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x89;
    uint64_t x90;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x91;
    uint64_t x92;
    uint64_t x93;
    uint64_t x94;
    uint64_t x95;
    uint64_t x96;
    uint64_t x97;
    uint64_t x98;
    uint64_t x99;
    uint64_t x100;
    uint64_t x101;
    uint64_t x102;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x103;
    uint64_t x104;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x105;
    uint64_t x106;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x107;
    uint64_t x108;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x109;
    uint64_t x110;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x111;
    uint64_t x112;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x113;
    uint64_t x114;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x115;
    uint64_t x116;
    uint64_t x117;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x118;
    uint64_t x119;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x120;
    uint64_t x121;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x122;
    uint64_t x123;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x124;
    uint64_t x125;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x126;
    uint64_t x127;
    uint64_t x128;
    uint64_t x129;
    uint64_t x130;
    x1 = (arg1[0]);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x2, &x3, x1, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x4, &x5, x2, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x6, &x7, x2, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x8, &x9, x2, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x10, &x11, x2, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x12, &x13, 0x0,
                                                              x11, x8);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x14, &x15, x13,
                                                              x9, x6);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x16, &x17, x15,
                                                              x7, x4);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x18, &x19, 0x0,
                                                              x1, x10);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x20, &x21, x19,
                                                              0x0, x12);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x22, &x23, x21,
                                                              0x0, x14);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x24, &x25, x23,
                                                              0x0, x16);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x26, &x27, 0x0,
                                                              x20, (arg1[1]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x28, &x29, x27,
                                                              x22, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x30, &x31, x29,
                                                              x24, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x32, &x33, x26, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x34, &x35, x32, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x36, &x37, x32, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x38, &x39, x32, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x40, &x41, x32, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x42, &x43, 0x0,
                                                              x41, x38);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x44, &x45, x43,
                                                              x39, x36);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x46, &x47, x45,
                                                              x37, x34);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x48, &x49, 0x0,
                                                              x26, x40);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x50, &x51, x49,
                                                              x28, x42);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x52, &x53, x51,
                                                              x30, x44);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x54, &x55, x53, (x31 + (x25 + (x17 + x5))), x46);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x56, &x57, 0x0,
                                                              x50, (arg1[2]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x58, &x59, x57,
                                                              x52, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x60, &x61, x59,
                                                              x54, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x62, &x63, x56, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x64, &x65, x62, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x66, &x67, x62, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x68, &x69, x62, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x70, &x71, x62, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x72, &x73, 0x0,
                                                              x71, x68);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x74, &x75, x73,
                                                              x69, x66);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x76, &x77, x75,
                                                              x67, x64);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x78, &x79, 0x0,
                                                              x56, x70);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x80, &x81, x79,
                                                              x58, x72);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x82, &x83, x81,
                                                              x60, x74);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x84, &x85, x83, (x61 + (x55 + (x47 + x35))), x76);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x86, &x87, 0x0,
                                                              x80, (arg1[3]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x88, &x89, x87,
                                                              x82, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x90, &x91, x89,
                                                              x84, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x92, &x93, x86, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x94, &x95, x92, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x96, &x97, x92, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x98, &x99, x92, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x100, &x101, x92, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x102, &x103, 0x0,
                                                              x101, x98);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x104, &x105,
                                                              x103, x99, x96);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x106, &x107,
                                                              x105, x97, x94);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x108, &x109, 0x0,
                                                              x86, x100);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x110, &x111,
                                                              x109, x88, x102);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x112, &x113,
                                                              x111, x90, x104);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x114, &x115, x113, (x91 + (x85 + (x77 + x65))), x106);
    x116 = (x115 + (x107 + x95));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x117, &x118, 0x0, x110, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x119, &x120, x118, x112, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x121, &x122, x120, x114, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x123, &x124, x122, x116, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(&x125, &x126,
                                                               x124, 0x0, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x127, x126, x117,
                                                            x110);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x128, x126, x119,
                                                            x112);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x129, x126, x121,
                                                            x114);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x130, x126, x123,
                                                            x116);
    out1[0] = x127;
    out1[1] = x128;
    out1[2] = x129;
    out1[3] = x130;
}